

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-input.c
# Opt level: O2

_Bool textui_get_rep_dir(int *dp,_Bool allow_5)

{
  byte bVar1;
  loc from;
  byte bVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  loc to;
  ulong uVar5;
  wchar_t wVar6;
  ui_event uVar7;
  keypress ch;
  keypress ch_00;
  
  *dp = 0;
  wVar6 = L'\0';
LAB_001dcbc8:
  if (wVar6 == L'\0') {
    event_signal(EVENT_MESSAGE_FLUSH);
    inkey_scan = 0xffffffff;
    uVar7 = inkey_ex();
    inkey_scan = 0;
    if ((uVar7.type == EVT_NONE) ||
       ((uVar7.type == EVT_KBRD &&
        (ch._8_4_ = uVar7._8_4_ & 0xff, ch._0_8_ = uVar7.mouse, wVar3 = target_dir_allow(ch,allow_5)
        , wVar3 == L'\0')))) {
      prt("Direction or <click> (Escape to cancel)? ",L'\0',L'\0');
      uVar7 = inkey_ex();
    }
    if (uVar7.type == EVT_MOUSE) {
      if (uVar7.key.code._2_1_ == '\x01') {
        from.x = (player->grid).x;
        from.y = (player->grid).y;
        to = (loc)loc((int)((uVar7.key.code & 0xff) - col_map[Term->sidebar_mode]) /
                      (int)(uint)tile_width + Term->offset_x,
                      (int)((uVar7.key.code >> 8 & 0xff) - row_top_map[Term->sidebar_mode]) /
                      (int)(uint)tile_height + Term->offset_y);
        wVar3 = pathfind_direction_to(from,to);
        goto LAB_001dcd7e;
      }
      if ((uVar7.key.code._2_2_ & 0xff) == 2) goto LAB_001dcd97;
      goto LAB_001dcd8a;
    }
    if (uVar7.type != EVT_KBRD) goto LAB_001dcd8a;
    wVar3 = L'\0';
    bVar2 = 1;
    while( true ) {
      uVar5 = uVar7._0_8_;
      if ((uVar5 >> 0x20 == 0) || (uVar7.type != EVT_KBRD)) break;
      if (uVar7.key.code == 0xe000) goto LAB_001dcd97;
      ch_00._8_4_ = uVar7._8_4_ & 0xff;
      ch_00.type = (int)uVar5;
      ch_00.code = (int)(uVar5 >> 0x20);
      wVar4 = target_dir_allow(ch_00,allow_5);
      if (wVar4 != L'\0') {
        wVar3 = dir_transitions[wVar3][wVar4];
      }
      bVar1 = (player->opts).lazymove_delay;
      if ((bool)(~bVar2 & 1) || bVar1 == 0) break;
      inkey_scan = (uint32_t)bVar1;
      uVar7 = inkey_ex();
      bVar2 = 0;
    }
    if (wVar3 != L'\x05' || allow_5) goto LAB_001dcd7e;
LAB_001dcd97:
    prt("",L'\0',L'\0');
  }
  else {
    prt("",L'\0',L'\0');
    *dp = wVar6;
  }
  return wVar6 != L'\0';
LAB_001dcd7e:
  wVar6 = wVar3;
  if (wVar6 == L'\0') {
LAB_001dcd8a:
    bell();
    wVar6 = L'\0';
  }
  goto LAB_001dcbc8;
}

Assistant:

static bool textui_get_rep_dir(int *dp, bool allow_5)
{
	int dir = 0;

	ui_event ke;

	/* Initialize */
	(*dp) = 0;

	/* Get a direction */
	while (!dir) {
		/* Paranoia*/
		event_signal(EVENT_MESSAGE_FLUSH);

		/* Get first keypress - the first test is to avoid displaying the
		 * prompt for direction if there's already a keypress queued up
		 * and waiting - this just avoids a flickering prompt if there is
		 * a "lazy" movement delay. */
		inkey_scan = SCAN_INSTANT;
		ke = inkey_ex();
		inkey_scan = SCAN_OFF;

		if (ke.type == EVT_NONE ||
				(ke.type == EVT_KBRD
				&& !target_dir_allow(ke.key, allow_5))) {
			prt("Direction or <click> (Escape to cancel)? ", 0, 0);
			ke = inkey_ex();
		}

		/* Check mouse coordinates, or get keypresses until a dir is chosen */
		if (ke.type == EVT_MOUSE) {
			if (ke.mouse.button == 1) {
				int y = KEY_GRID_Y(ke);
				int x = KEY_GRID_X(ke);
				struct loc from = player->grid;
				struct loc to = loc(x, y);

				dir = pathfind_direction_to(from, to);
			} else if (ke.mouse.button == 2) {
				/* Clear the prompt */
				prt("", 0, 0);

				return (false);
			}
		} else if (ke.type == EVT_KBRD) {
			int keypresses_handled = 0;

			while (ke.type == EVT_KBRD && ke.key.code != 0) {
				int this_dir;

				if (ke.key.code == ESCAPE) {
					/* Clear the prompt */
					prt("", 0, 0);

					return (false);
				}

				/* XXX Ideally show and move the cursor here to indicate
				 the currently "Pending" direction. XXX */
				this_dir = target_dir_allow(ke.key, allow_5);

				if (this_dir)
					dir = dir_transitions[dir][this_dir];

				if (player->opts.lazymove_delay == 0 || ++keypresses_handled > 1)
					break;

				inkey_scan = player->opts.lazymove_delay;
				ke = inkey_ex();
			}

			/* 5 is equivalent to "escape" */
			if (dir == 5 && !allow_5) {
				/* Clear the prompt */
				prt("", 0, 0);

				return (false);
			}
		}

		/* Oops */
		if (!dir) bell();
	}

	/* Clear the prompt */
	prt("", 0, 0);

	/* Save direction */
	(*dp) = dir;

	/* Success */
	return (true);
}